

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O3

void ftghtb_(int *A1,int *A2,int *A3,int *A4,int *A5,char *A6,int *A7,char *A8,char *A9,char *A10,
            int *A11,size_t C6,size_t C8,size_t C9,size_t C10)

{
  int iVar1;
  char **ttype;
  char *pcVar2;
  long *tbcol;
  long lVar3;
  char **tform;
  char **tunit;
  char *s;
  size_t sVar4;
  size_t sVar5;
  int celem_len;
  int nelem;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int celem_len_00;
  long lVar10;
  long B4;
  long B3;
  ulong local_68;
  ulong local_60;
  fitsfile *local_58;
  int *local_50;
  int *local_48;
  char *local_40;
  long tfields;
  unsigned_long uVar6;
  
  local_58 = gFitsFiles[*A1];
  uVar9 = *A2;
  lVar10 = (long)(int)uVar9;
  uVar8 = 0;
  ffgkyj(local_58,"TFIELDS",&tfields,(char *)0x0,A11);
  if (tfields < lVar10) {
    uVar9 = (uint)tfields;
  }
  local_68 = tfields & 0xffffffff;
  if (-1 < lVar10) {
    local_68 = (ulong)uVar9;
  }
  B3 = (long)*A3;
  uVar7 = 1;
  if (1 < (int)local_68) {
    uVar7 = local_68;
  }
  uVar6 = C6;
  if (C6 < gMinStrLen) {
    uVar6 = gMinStrLen;
  }
  B4 = (long)*A4;
  uVar9 = (int)uVar6 + 1;
  sVar4 = uVar7 * 8;
  local_50 = A3;
  local_48 = A4;
  ttype = (char **)malloc(sVar4);
  nelem = (int)uVar7;
  pcVar2 = (char *)malloc((ulong)(uVar9 * nelem));
  *ttype = pcVar2;
  local_40 = A6;
  pcVar2 = f2cstrv2(A6,pcVar2,(int)C6,uVar9,nelem);
  do {
    ttype[uVar8] = pcVar2;
    uVar8 = uVar8 + 1;
    pcVar2 = pcVar2 + (int)uVar9;
  } while (uVar7 != uVar8);
  iVar1 = *A2;
  lVar10 = (long)iVar1;
  local_60 = (ulong)uVar9;
  tbcol = (long *)malloc(lVar10 * 8);
  if (0 < lVar10) {
    lVar3 = 0;
    do {
      tbcol[lVar3] = (long)A7[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar10 != lVar3);
  }
  uVar6 = C8;
  if (C8 < gMinStrLen) {
    uVar6 = gMinStrLen;
  }
  celem_len = (int)uVar6 + 1;
  tform = (char **)malloc(sVar4);
  pcVar2 = (char *)malloc((ulong)(uint)(celem_len * nelem));
  *tform = pcVar2;
  pcVar2 = f2cstrv2(A8,pcVar2,(int)C8,celem_len,nelem);
  uVar8 = 0;
  do {
    tform[uVar8] = pcVar2;
    uVar8 = uVar8 + 1;
    pcVar2 = pcVar2 + celem_len;
  } while (uVar7 != uVar8);
  uVar6 = C9;
  if (C9 < gMinStrLen) {
    uVar6 = gMinStrLen;
  }
  celem_len_00 = (int)uVar6 + 1;
  tunit = (char **)malloc(sVar4);
  pcVar2 = (char *)malloc((ulong)(uint)(celem_len_00 * nelem));
  *tunit = pcVar2;
  pcVar2 = f2cstrv2(A9,pcVar2,(int)C9,celem_len_00,nelem);
  uVar8 = 0;
  do {
    tunit[uVar8] = pcVar2;
    uVar8 = uVar8 + 1;
    pcVar2 = pcVar2 + celem_len_00;
  } while (uVar7 != uVar8);
  sVar5 = gMinStrLen;
  if (gMinStrLen <= C10) {
    sVar5 = C10;
  }
  s = (char *)malloc(sVar5 + 1);
  s[C10] = '\0';
  pcVar2 = A10;
  memcpy(s,A10,C10);
  kill_trailing(s,(char)pcVar2);
  ffghtb(local_58,(int)local_68,&B3,&B4,A5,ttype,tbcol,tform,tunit,s,A11);
  *local_50 = (int)B3;
  *local_48 = (int)B4;
  c2fstrv2(*ttype,local_40,(int)local_60,(int)C6,nelem);
  free(*ttype);
  free(ttype);
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      A7[lVar3] = (int)tbcol[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar10 != lVar3);
  }
  free(tbcol);
  c2fstrv2(*tform,A8,celem_len,(int)C8,nelem);
  free(*tform);
  free(tform);
  c2fstrv2(*tunit,A9,celem_len_00,(int)C9,nelem);
  free(*tunit);
  free(tunit);
  if (s != (char *)0x0) {
    sVar4 = strlen(s);
    sVar5 = C10;
    if (sVar4 < C10) {
      sVar5 = sVar4;
    }
    memcpy(A10,s,sVar5);
    if (sVar4 <= C10 && C10 - sVar4 != 0) {
      memset(A10 + sVar4,0x20,C10 - sVar4);
    }
    free(s);
  }
  return;
}

Assistant:

CFextern VOID_cfF(FTGHTB,ftghtb)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,INT,PLONG,PLONG,PINT,PSTRINGV,LONGV,PSTRINGV,PSTRINGV,PSTRING,PINT,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(INT,2)
   QCF(PLONG,3)
   QCF(PLONG,4)
   QCF(PINT,5)
   QCF(PSTRINGV,6)
   QCF(LONGV,7)
   QCF(PSTRINGV,8)
   QCF(PSTRINGV,9)
   QCF(PSTRING,10)
   QCF(PINT,11)

   fitsfile *fptr;
   long tfields;
   int maxdim,*status;

   fptr = TCF(ftghtb,FITSUNIT,1,0);
   status =  TCF(ftghtb,PINT,11,0);
   maxdim =  TCF(ftghtb,INT,2,0);
   ffgkyj( fptr, "TFIELDS", &tfields, 0, status );
   maxdim = (maxdim<0) ? tfields : _cfMIN(tfields,maxdim);

   ffghtb(   fptr, maxdim
             TCF(ftghtb,PLONG,3,1)
             TCF(ftghtb,PLONG,4,1)
             TCF(ftghtb,PINT,5,1)
             TCF(ftghtb,PSTRINGV,6,1)
             TCF(ftghtb,LONGV,7,1)
             TCF(ftghtb,PSTRINGV,8,1)
             TCF(ftghtb,PSTRINGV,9,1)
             TCF(ftghtb,PSTRING,10,1)
             , status );

   RCF(FITSUNIT,1)
   RCF(INT,2)
   RCF(PLONG,3)
   RCF(PLONG,4)
   RCF(PINT,5)
   RCF(PSTRINGV,6)
   RCF(LONGV,7)
   RCF(PSTRINGV,8)
   RCF(PSTRINGV,9)
   RCF(PSTRING,10)
   RCF(PINT,11)
}